

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O2

s32 __thiscall irr::gui::CGUIFont::getAreaFromCharacter(CGUIFont *this,wchar_t c)

{
  const_iterator cVar1;
  u32 *puVar2;
  wchar_t local_c;
  
  local_c = c;
  cVar1 = ::std::
          _Rb_tree<wchar_t,_std::pair<const_wchar_t,_int>,_std::_Select1st<std::pair<const_wchar_t,_int>_>,_std::less<wchar_t>,_std::allocator<std::pair<const_wchar_t,_int>_>_>
          ::find(&(this->CharacterMap)._M_t,&local_c);
  puVar2 = &this->WrongCharacter;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->CharacterMap)._M_t._M_impl.super__Rb_tree_header)
  {
    puVar2 = (u32 *)&cVar1._M_node[1].field_0x4;
  }
  return *puVar2;
}

Assistant:

s32 CGUIFont::getAreaFromCharacter(const wchar_t c) const
{
	auto n = CharacterMap.find(c);
	if (n != CharacterMap.end())
		return n->second;
	else
		return WrongCharacter;
}